

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array_stack.cpp
# Opt level: O0

void __thiscall ArrayStack_PushAndPop1Value_Test::TestBody(ArrayStack_PushAndPop1Value_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  Message local_60 [3];
  size_type local_48;
  uint local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  undefined1 local_20 [8];
  array_stack<int,_2UL> stack;
  ArrayStack_PushAndPop1Value_Test *this_local;
  
  stack.elements_ = (size_t)this;
  pstore::array_stack<int,_2UL>::array_stack((array_stack<int,_2UL> *)local_20);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x1f;
  pstore::array_stack<int,_2UL>::push
            ((array_stack<int,_2UL> *)local_20,
             (value_type *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  pstore::array_stack<int,_2UL>::pop((array_stack<int,_2UL> *)local_20);
  local_3c = 0;
  local_48 = pstore::array_stack<int,_2UL>::size((array_stack<int,_2UL> *)local_20);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_38,"0U","stack.size ()",&local_3c,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_array_stack.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_79 = pstore::array_stack<int,_2UL>::empty((array_stack<int,_2UL> *)local_20);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_78,(AssertionResult *)"stack.empty ()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_array_stack.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST (ArrayStack, PushAndPop1Value) {
    pstore::array_stack<int, 2> stack;
    stack.push (31);
    stack.pop ();
    EXPECT_EQ (0U, stack.size ());
    EXPECT_TRUE (stack.empty ());
}